

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TransformFeedbackTypeValidator::validateSingleVariable
          (TransformFeedbackTypeValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  bool bVar1;
  DataType DVar2;
  DataType DVar3;
  const_reference this_00;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  VarType *local_398;
  allocator<char> local_381;
  string local_380;
  char *local_360;
  MessageBuilder local_358;
  char *local_1d8 [3];
  MessageBuilder local_1c0;
  VarType *local_40;
  VarType *elementType;
  VarType *variable;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  TransformFeedbackTypeValidator *this_local;
  
  variable = (VarType *)implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)path;
  path_local = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)this;
  this_00 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            ::back(path);
  elementType = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(this_00);
  bVar1 = glu::VarType::isArrayType(elementType);
  if (bVar1) {
    local_398 = glu::VarType::getElementType(elementType);
  }
  else {
    local_398 = elementType;
  }
  local_40 = local_398;
  pTVar4 = tcu::TestContext::getLog
                     ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx
                     );
  tcu::TestLog::operator<<(&local_1c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [27])"Verifying type, expecting ");
  DVar2 = glu::VarType::getBasicType(local_40);
  local_1d8[0] = glu::getDataTypeName(DVar2);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1d8);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  DVar2 = glu::VarType::getBasicType(local_40);
  DVar3 = glu::getDataTypeFromGLType(implementationName_local._4_4_);
  if (DVar2 != DVar3) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TransformFeedbackResourceValidator).super_PropValidator.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_358,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [13])"\tError, got ");
    DVar2 = glu::getDataTypeFromGLType(implementationName_local._4_4_);
    local_360 = glu::getDataTypeName(DVar2);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_360);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"resource type invalid",&local_381);
    PropValidator::setError((PropValidator *)this,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator(&local_381);
  }
  return;
}

Assistant:

void TransformFeedbackTypeValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	// Unlike other interfaces, xfb program interface uses just variable name to refer to arrays of basic types. (Others use "variable[0]")
	// Thus we might end up querying a type for an array. In this case, return the type of an array element.
	const glu::VarType& variable    = *path.back().getVariableType();
	const glu::VarType& elementType = (variable.isArrayType()) ? (variable.getElementType()) : (variable);

	DE_ASSERT(elementType.isBasicType());

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying type, expecting " << glu::getDataTypeName(elementType.getBasicType()) << tcu::TestLog::EndMessage;
	if (elementType.getBasicType() != glu::getDataTypeFromGLType(propValue))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << glu::getDataTypeName(glu::getDataTypeFromGLType(propValue)) << tcu::TestLog::EndMessage;
		setError("resource type invalid");
	}
}